

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O0

void array_suite::test_string(void)

{
  string *this;
  reference pvVar1;
  char *msg;
  allocator<char> local_101;
  string *local_100;
  undefined1 local_f8 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> value;
  iarchive in;
  value_type input [11];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._0_7_ = 0xa9424102a90292;
  stack0xffffffffffffffef = 0x93444302;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[11]>
            ((iarchive *)((long)&value._M_elems[1].field_2 + 8),
             (uchar (*) [11])
             ((long)&in.reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data + 0x48));
  msg._2_1_ = 1;
  local_100 = (string *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_f8,"",&local_101);
  this = (string *)(value._M_elems[0].field_2._M_local_buf + 8);
  local_100 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,"",(allocator<char> *)((long)&msg + 3));
  msg._2_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&msg + 3));
  std::allocator<char>::~allocator(&local_101);
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)
             (value._M_elems[1].field_2._M_local_buf + 8),
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)local_f8);
  pvVar1 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
           ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                         *)local_f8,0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("value[0]","\"AB\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x33,"void array_suite::test_string()",pvVar1,"AB");
  pvVar1 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
           ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                         *)local_f8,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("value[1]","\"CD\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x34,"void array_suite::test_string()",pvVar1,"CD");
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *)local_f8);
  trial::protocol::bintoken::iarchive::~iarchive((iarchive *)((long)&value._M_elems[1].field_2 + 8))
  ;
  return;
}

Assistant:

void test_string()
{
    const value_type input[] = { token::code::begin_array,
                                 0x02,
                                 token::code::string8, 0x02, 0x41, 0x42,
                                 token::code::string8, 0x02, 0x43, 0x44,
                                 token::code::end_array };
    format::iarchive in(input);
    std::array<std::string, 2> value = {{ "", "" }};
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], "AB");
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], "CD");
}